

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O2

void skip_utf8_bom_should_skip_bom(void)

{
  long lVar1;
  parse_buffer *ppVar2;
  long in_FS_OFFSET;
  parse_buffer local_50;
  uchar string [6];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.content = string;
  builtin_memcpy(string,"\xfeff{}",6);
  local_50.offset = 0;
  local_50.depth = 0;
  local_50.length = 6;
  local_50.hooks.allocate = global_hooks.allocate;
  local_50.hooks.deallocate = global_hooks.deallocate;
  local_50.hooks.reallocate = global_hooks.reallocate;
  ppVar2 = skip_utf8_bom(&local_50);
  if (ppVar2 != &local_50) {
    UnityFail(" Expected TRUE Was FALSE",0x1ce);
  }
  UnityAssertEqualNumber(3,local_50.offset & 0xffffffff,(char *)0x0,0x1cf,UNITY_DISPLAY_STYLE_UINT);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void skip_utf8_bom_should_skip_bom(void)
{
    const unsigned char string[] = "\xEF\xBB\xBF{}";
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = string;
    buffer.length = sizeof(string);
    buffer.hooks = global_hooks;

    TEST_ASSERT_TRUE(skip_utf8_bom(&buffer) == &buffer);
    TEST_ASSERT_EQUAL_UINT(3U, (unsigned int)buffer.offset);
}